

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseArgumentsCommand.cxx
# Opt level: O3

bool __thiscall
cmParseArgumentsCommand::InitialPass
          (cmParseArgumentsCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  pointer pbVar4;
  pointer pbVar5;
  bool bVar6;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  _Var7;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var9;
  _Base_ptr p_Var10;
  string *psVar11;
  long *plVar12;
  size_type *psVar13;
  ulong *puVar14;
  char *value;
  const_iterator __begin2;
  pointer pbVar15;
  _Alloc_hider _Var16;
  ulong uVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  unsigned_long uVar20;
  const_iterator __end2;
  pointer pbVar21;
  string_view name;
  string_view name_00;
  string_view name_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_bool>
  pVar22;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar23;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_bool>
  pVar24;
  string argc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string prefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keywordsMissingValues;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsed;
  unsigned_long count;
  unsigned_long argvStart;
  UserArgumentParser parser;
  char *arg;
  options_map options;
  ostringstream argName;
  multi_map multiValArgs;
  single_map singleValArgs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  cmCommand *local_348;
  string local_340;
  int local_31c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  ulong local_2e0;
  undefined1 local_2d8 [24];
  long lStack_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined8 local_2a8;
  ulong local_298;
  unsigned_long local_290;
  cmArgumentParser<void> local_288;
  pointer local_268;
  cmRange<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  undefined1 local_250 [24];
  undefined1 local_238 [16];
  _Rb_tree_node_base local_228;
  undefined1 local_208 [40];
  size_t local_1e0;
  ios_base local_198 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  pbVar21 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar17 = (long)pbVar1 - (long)pbVar21;
  local_348 = &this->super_cmCommand;
  if (uVar17 < 0x61) {
    local_208._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_208 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_208,"must be called with at least 4 arguments.","");
    cmCommand::SetError(local_348,(string *)local_208);
    local_300.field_2._M_allocated_capacity = local_208._16_8_;
    _Var16._M_p = (pointer)local_208._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_208 + 0x10)) goto LAB_0024cd7e;
  }
  else {
    local_290 = 0;
    local_31c = std::__cxx11::string::compare((char *)pbVar21);
    if (local_31c == 0) {
      if ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start == 0xc0) {
        bVar6 = cmSystemTools::StringToULong(pbVar21[1]._M_dataplus._M_p,&local_290);
        if (bVar6) {
          pbVar21 = pbVar21 + 2;
          goto LAB_0024bebb;
        }
        pcVar3 = local_348->Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_238,"PARSE_ARGV index \'",pbVar21 + 1);
        plVar12 = (long *)std::__cxx11::string::append((char *)local_238);
        puVar14 = (ulong *)(plVar12 + 2);
        if ((ulong *)*plVar12 == puVar14) {
          local_208._16_8_ = *puVar14;
          local_208._24_8_ = plVar12[3];
          local_208._0_8_ = local_208 + 0x10;
        }
        else {
          local_208._16_8_ = *puVar14;
          local_208._0_8_ = (ulong *)*plVar12;
        }
        local_208._8_8_ = plVar12[1];
        *plVar12 = (long)puVar14;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_208);
        if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
          operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
        }
        if ((_Base_ptr)local_238._0_8_ != (_Base_ptr)(local_238 + 0x10)) goto LAB_0024cd6c;
      }
      else {
        pcVar3 = local_348->Makefile;
        local_208._0_8_ = local_208 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_208,"PARSE_ARGV must be called with exactly 6 arguments.","");
        cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_208);
        local_228._0_8_ = local_208._16_8_;
        local_238._0_8_ = local_208._0_8_;
        if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
LAB_0024cd6c:
          operator_delete((void *)local_238._0_8_,
                          (ulong)((long)&((_Base_ptr)local_228._0_8_)->_M_color + 1));
        }
      }
      cmSystemTools::s_FatalErrorOccured = true;
      goto LAB_0024cd7e;
    }
LAB_0024bebb:
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    pcVar2 = (pbVar21->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_300,pcVar2,pcVar2 + pbVar21->_M_string_length);
    std::__cxx11::string::append((char *)&local_300);
    local_288.Bindings.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.Bindings.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.Bindings.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228._M_parent = (_Base_ptr)(local_238 + 8);
    local_238._8_4_ = _S_red;
    local_228._0_8_ = (_Base_ptr)0x0;
    local_228._M_right = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_90._M_impl.super__Rb_tree_header._M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2a8 = 0;
    local_2b8._M_allocated_capacity = 0;
    local_2b8._8_8_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_2e0 = uVar17;
    local_268 = pbVar1;
    local_228._M_left = local_228._M_parent;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    cmSystemTools::ExpandListArgument(pbVar21 + 1,&local_318,false);
    pbVar1 = local_318.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar15 = local_318.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_208._0_8_ = local_208._0_8_ & 0xffffffffffffff00;
        pVar22 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                 ::_M_emplace_unique<std::__cxx11::string_const&,bool>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                             *)local_238,pbVar15,(bool *)local_208);
        _Var7 = pVar22.first._M_node;
        name._M_str = *(char **)(_Var7._M_node + 1);
        name._M_len = (size_t)_Var7._M_node[1]._M_parent;
        bVar6 = cmArgumentParser<void>::Bind<bool>(&local_288,name,(bool *)(_Var7._M_node + 2));
        if (!bVar6) {
          pcVar3 = local_348->Makefile;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208,"keyword defined more than once: ",pbVar15);
          cmMakefile::IssueMessage
                    (pcVar3,WARNING,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208)
          ;
          if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
            operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
          }
        }
        pbVar5 = local_318.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = local_318.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar15 = pbVar15 + 1;
      } while (pbVar15 != pbVar1);
      if (local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar19 = &(local_318.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (paVar19 + -1))->_M_dataplus)._M_p;
          if (paVar19 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar12) {
            operator_delete(plVar12,paVar19->_M_allocated_capacity + 1);
          }
          pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (paVar19 + 1);
          paVar19 = paVar19 + 2;
        } while (pbVar18 != pbVar5);
        local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
      }
    }
    cmSystemTools::ExpandListArgument(pbVar21 + 2,&local_318,false);
    pbVar1 = local_318.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_208 + 0x10);
      pbVar15 = local_318.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_208._8_8_ = 0;
        local_208._16_8_ = local_208._16_8_ & 0xffffffffffffff00;
        local_208._0_8_ = paVar19;
        pVar23 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                             *)&local_60,pbVar15,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_208);
        _Var8 = pVar23.first._M_node;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._0_8_ != paVar19) {
          operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
        }
        name_00._M_str = *(char **)(_Var8._M_node + 1);
        name_00._M_len = (size_t)_Var8._M_node[1]._M_parent;
        bVar6 = cmArgumentParser<void>::Bind<std::__cxx11::string>
                          (&local_288,name_00,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (_Var8._M_node + 2));
        if (!bVar6) {
          pcVar3 = local_348->Makefile;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208,"keyword defined more than once: ",pbVar15);
          cmMakefile::IssueMessage
                    (pcVar3,WARNING,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._0_8_ != paVar19) {
            operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
          }
        }
        pbVar5 = local_318.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = local_318.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar15 = pbVar15 + 1;
      } while (pbVar15 != pbVar1);
      if (local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar19 = &(local_318.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (paVar19 + -1))->_M_dataplus)._M_p;
          if (paVar19 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar12) {
            operator_delete(plVar12,paVar19->_M_allocated_capacity + 1);
          }
          pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (paVar19 + 1);
          paVar19 = paVar19 + 2;
        } while (pbVar18 != pbVar5);
        local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
      }
    }
    cmSystemTools::ExpandListArgument(pbVar21 + 3,&local_318,false);
    pbVar1 = local_318.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar15 = local_318.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_208._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_208._8_8_ = 0;
        local_208._16_8_ = 0;
        pVar24 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                 ::
                 _M_emplace_unique<std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                             *)&local_90,pbVar15,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_208);
        _Var9 = pVar24.first._M_node;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_208);
        name_01._M_str = *(char **)(_Var9._M_node + 1);
        name_01._M_len = (size_t)_Var9._M_node[1]._M_parent;
        bVar6 = cmArgumentParser<void>::
                Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (&local_288,name_01,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(_Var9._M_node + 2));
        if (!bVar6) {
          pcVar3 = local_348->Makefile;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208,"keyword defined more than once: ",pbVar15);
          cmMakefile::IssueMessage
                    (pcVar3,WARNING,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208)
          ;
          if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
            operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
          }
        }
        pbVar5 = local_318.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = local_318.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar15 = pbVar15 + 1;
      } while (pbVar15 != pbVar1);
      if (local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar19 = &(local_318.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (paVar19 + -1))->_M_dataplus)._M_p;
          if (paVar19 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar12) {
            operator_delete(plVar12,paVar19->_M_allocated_capacity + 1);
          }
          pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (paVar19 + 1);
          paVar19 = paVar19 + 2;
        } while (pbVar18 != pbVar5);
        local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
      }
    }
    pbVar1 = local_268;
    if (local_31c == 0) {
      pcVar3 = local_348->Makefile;
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_208 + 0x10);
      local_208._0_8_ = paVar19;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"ARGC","");
      uVar17 = local_2e0;
      psVar11 = cmMakefile::GetSafeDefinition(pcVar3,(string *)local_208);
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      pcVar2 = (psVar11->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_368,pcVar2,pcVar2 + psVar11->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._0_8_ != paVar19) {
        operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
      }
      bVar6 = cmSystemTools::StringToULong(local_368._M_dataplus._M_p,&local_298);
      if (bVar6) {
        if (local_290 < local_298) {
          uVar20 = local_290;
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"ARGV",4);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            pcVar3 = local_348->Makefile;
            std::__cxx11::stringbuf::str();
            p_Var10 = (_Base_ptr)cmMakefile::GetDefinition(pcVar3,&local_340);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._M_dataplus._M_p != &local_340.field_2) {
              operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1
                             );
            }
            local_250._16_8_ = p_Var10;
            if (p_Var10 == (_Base_ptr)0x0) {
              pcVar3 = local_348->Makefile;
              std::__cxx11::stringbuf::str();
              plVar12 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_260,0,(char *)0x0,0x52a6a7);
              local_2d8._0_8_ = local_2d8 + 0x10;
              pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (plVar12 + 2);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar12 ==
                  pbVar18) {
                local_2d8._16_8_ = (pbVar18->_M_dataplus)._M_p;
                lStack_2c0 = plVar12[3];
              }
              else {
                local_2d8._16_8_ = (pbVar18->_M_dataplus)._M_p;
                local_2d8._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar12;
              }
              local_2d8._8_8_ = plVar12[1];
              *plVar12 = (long)pbVar18;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append(local_2d8);
              local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
              psVar13 = (size_type *)(plVar12 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_340.field_2._M_allocated_capacity = *psVar13;
                local_340.field_2._8_8_ = plVar12[3];
              }
              else {
                local_340.field_2._M_allocated_capacity = *psVar13;
                local_340._M_dataplus._M_p = (pointer)*plVar12;
              }
              local_340._M_string_length = plVar12[1];
              *plVar12 = (long)psVar13;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_340);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_340._M_dataplus._M_p != &local_340.field_2) {
                operator_delete(local_340._M_dataplus._M_p,
                                local_340.field_2._M_allocated_capacity + 1);
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_2d8._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_2d8 + 0x10)) {
                operator_delete((void *)local_2d8._0_8_,
                                (ulong)((long)&((_Alloc_hider *)local_2d8._16_8_)->_M_p + 1));
              }
              if (local_260.Begin._M_node != (_Base_ptr)local_250) {
                operator_delete(local_260.Begin._M_node,local_250._0_8_ + 1);
              }
              cmSystemTools::s_FatalErrorOccured = true;
            }
            else {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const*&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_318,(char **)(local_250 + 0x10));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
            std::ios_base::~ios_base(local_198);
            if (p_Var10 == (_Base_ptr)0x0) {
              uVar17 = local_2e0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_368._M_dataplus._M_p != &local_368.field_2) {
                operator_delete(local_368._M_dataplus._M_p,
                                local_368.field_2._M_allocated_capacity + 1);
                uVar17 = local_2e0;
              }
              goto LAB_0024cacc;
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 < local_298);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != &local_368.field_2) {
          operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0024c305;
      }
      pcVar3 = local_348->Makefile;
      std::operator+(&local_340,"PARSE_ARGV called with ARGC=\'",&local_368);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_340);
      puVar14 = (ulong *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_208._16_8_ = *puVar14;
        local_208._24_8_ = plVar12[3];
        local_208._0_8_ = paVar19;
      }
      else {
        local_208._16_8_ = *puVar14;
        local_208._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar12;
      }
      local_208._8_8_ = plVar12[1];
      *plVar12 = (long)puVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._0_8_ != paVar19) {
        operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      cmSystemTools::s_FatalErrorOccured = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      psVar11 = pbVar21 + 4;
      if (psVar11 != local_268) {
        do {
          cmSystemTools::ExpandListArgument(psVar11,&local_318,false);
          psVar11 = psVar11 + 1;
        } while (psVar11 != pbVar1);
      }
LAB_0024c305:
      local_2d8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_2d8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_2d8._16_8_ = (pointer)0x0;
      cmArgumentParser<void>::
      Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_288,&local_318,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_2b8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2d8);
      pcVar3 = local_348->Makefile;
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_208,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_2d8._0_8_,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_2d8._8_8_);
      if (local_228._M_parent != (_Rb_tree_node_base *)(local_238 + 8)) {
        p_Var10 = local_228._M_parent;
        do {
          std::operator+(&local_368,&local_300,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var10 + 1));
          value = "TRUE";
          if ((char)p_Var10[2]._M_color == _S_red) {
            value = "FALSE";
          }
          cmMakefile::AddDefinition(pcVar3,&local_368,value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
          }
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while (p_Var10 != (_Rb_tree_node_base *)(local_238 + 8));
      }
      if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_60._M_impl.super__Rb_tree_header) {
        p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          if (p_Var10[2]._M_parent == (_Base_ptr)0x0) {
            std::operator+(&local_368,&local_300,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var10 + 1));
            cmMakefile::RemoveDefinition(pcVar3,&local_368);
          }
          else {
            std::operator+(&local_368,&local_300,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var10 + 1));
            cmMakefile::AddDefinition(pcVar3,&local_368,*(char **)(p_Var10 + 2));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
          }
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while ((_Rb_tree_header *)p_Var10 != &local_60._M_impl.super__Rb_tree_header);
      }
      if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_90._M_impl.super__Rb_tree_header) {
        p_Var10 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          if (*(_Base_ptr *)(p_Var10 + 2) == p_Var10[2]._M_parent) {
            std::operator+(&local_368,&local_300,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var10 + 1));
            cmMakefile::RemoveDefinition(pcVar3,&local_368);
          }
          else {
            std::operator+(&local_368,&local_300,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var10 + 1));
            JoinList(&local_340,
                     *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       **)(p_Var10 + 2),SUB81(p_Var10[2]._M_parent,0));
            cmMakefile::AddDefinition(pcVar3,&local_368,local_340._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._M_dataplus._M_p != &local_340.field_2) {
              operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
          }
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while ((_Rb_tree_header *)p_Var10 != &local_90._M_impl.super__Rb_tree_header);
      }
      if (local_2b8._M_allocated_capacity == local_2b8._8_8_) {
        local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_368,local_300._M_dataplus._M_p,
                   local_300._M_dataplus._M_p + local_300._M_string_length);
        uVar17 = local_2e0;
        std::__cxx11::string::append((char *)&local_368);
        cmMakefile::RemoveDefinition(pcVar3,&local_368);
      }
      else {
        local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_368,local_300._M_dataplus._M_p,
                   local_300._M_dataplus._M_p + local_300._M_string_length);
        uVar17 = local_2e0;
        std::__cxx11::string::append((char *)&local_368);
        JoinList(&local_340,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2b8._M_allocated_capacity,SUB81(local_2b8._8_8_,0));
        cmMakefile::AddDefinition(pcVar3,&local_368,local_340._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
      if (local_1e0 == 0) {
        local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_368,local_300._M_dataplus._M_p,
                   local_300._M_dataplus._M_p + local_300._M_string_length);
        std::__cxx11::string::append((char *)&local_368);
        cmMakefile::RemoveDefinition(pcVar3,&local_368);
      }
      else {
        local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_368,local_300._M_dataplus._M_p,
                   local_300._M_dataplus._M_p + local_300._M_string_length);
        std::__cxx11::string::append((char *)&local_368);
        local_260.End._M_node = (_Base_ptr)(local_208 + 8);
        local_260.Begin._M_node = (_Base_ptr)local_208._24_8_;
        cmJoin<cmRange<std::_Rb_tree_const_iterator<std::__cxx11::string>>>
                  (&local_340,&local_260,";");
        cmMakefile::AddDefinition(pcVar3,&local_368,local_340._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_208);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2d8);
    }
LAB_0024cacc:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_318);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_2b8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_90);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *)local_238);
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
               *)&local_288);
    _Var16._M_p = local_300._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p == &local_300.field_2) goto LAB_0024cd7e;
  }
  operator_delete(_Var16._M_p,local_300.field_2._M_allocated_capacity + 1);
LAB_0024cd7e:
  return 0x60 < uVar17;
}

Assistant:

bool cmParseArgumentsCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus&)
{
  // cmake_parse_arguments(prefix options single multi <ARGN>)
  //                         1       2      3      4
  // or
  // cmake_parse_arguments(PARSE_ARGV N prefix options single multi)
  if (args.size() < 4) {
    this->SetError("must be called with at least 4 arguments.");
    return false;
  }

  std::vector<std::string>::const_iterator argIter = args.begin(),
                                           argEnd = args.end();
  bool parseFromArgV = false;
  unsigned long argvStart = 0;
  if (*argIter == "PARSE_ARGV") {
    if (args.size() != 6) {
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        "PARSE_ARGV must be called with exactly 6 arguments.");
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }
    parseFromArgV = true;
    argIter++; // move past PARSE_ARGV
    if (!cmSystemTools::StringToULong(argIter->c_str(), &argvStart)) {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                   "PARSE_ARGV index '" + *argIter +
                                     "' is not an unsigned integer");
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }
    argIter++; // move past N
  }
  // the first argument is the prefix
  const std::string prefix = (*argIter++) + "_";

  UserArgumentParser parser;

  // define the result maps holding key/value pairs for
  // options, single values and multi values
  options_map options;
  single_map singleValArgs;
  multi_map multiValArgs;

  // anything else is put into a vector of unparsed strings
  std::vector<std::string> unparsed;

  auto const duplicateKey = [this](std::string const& key) {
    this->GetMakefile()->IssueMessage(
      MessageType::WARNING, "keyword defined more than once: " + key);
  };

  // the second argument is a (cmake) list of options without argument
  std::vector<std::string> list;
  cmSystemTools::ExpandListArgument(*argIter++, list);
  parser.Bind(list, options, duplicateKey);

  // the third argument is a (cmake) list of single argument options
  list.clear();
  cmSystemTools::ExpandListArgument(*argIter++, list);
  parser.Bind(list, singleValArgs, duplicateKey);

  // the fourth argument is a (cmake) list of multi argument options
  list.clear();
  cmSystemTools::ExpandListArgument(*argIter++, list);
  parser.Bind(list, multiValArgs, duplicateKey);

  list.clear();
  if (!parseFromArgV) {
    // Flatten ;-lists in the arguments into a single list as was done
    // by the original function(CMAKE_PARSE_ARGUMENTS).
    for (; argIter != argEnd; ++argIter) {
      cmSystemTools::ExpandListArgument(*argIter, list);
    }
  } else {
    // in the PARSE_ARGV move read the arguments from ARGC and ARGV#
    std::string argc = this->Makefile->GetSafeDefinition("ARGC");
    unsigned long count;
    if (!cmSystemTools::StringToULong(argc.c_str(), &count)) {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                   "PARSE_ARGV called with ARGC='" + argc +
                                     "' that is not an unsigned integer");
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }
    for (unsigned long i = argvStart; i < count; ++i) {
      std::ostringstream argName;
      argName << "ARGV" << i;
      const char* arg = this->Makefile->GetDefinition(argName.str());
      if (!arg) {
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                     "PARSE_ARGV called with " +
                                       argName.str() + " not set");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      list.emplace_back(arg);
    }
  }

  std::vector<std::string> keywordsMissingValues;

  parser.Parse(list, &unparsed, &keywordsMissingValues);

  PassParsedArguments(
    prefix, *this->Makefile, options, singleValArgs, multiValArgs, unparsed,
    options_set(keywordsMissingValues.begin(), keywordsMissingValues.end()),
    parseFromArgV);

  return true;
}